

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace14.h
# Opt level: O0

Worker * lace_steal(WorkerP *self,Task *__dq_head,Worker *victim)

{
  anon_struct_8_2_24e63f91_for_ts aVar1;
  _Task *p_Var2;
  bool bVar3;
  Task *t;
  TailSplit local_38;
  TailSplitNA ts_new;
  TailSplitNA ts;
  Worker *victim_local;
  Task *__dq_head_local;
  WorkerP *self_local;
  
  if ((victim != (Worker *)0x0) && (victim->allstolen == '\0')) {
    aVar1 = (victim->ts).ts;
    ts_new.ts.tail = aVar1.tail;
    ts_new.ts.split = aVar1.split;
    if (ts_new.ts.tail < ts_new.ts.split) {
      local_38.ts.split = ts_new.ts.split;
      local_38.ts.tail = ts_new.ts.tail + 1;
      LOCK();
      bVar3 = aVar1 == (anon_struct_8_2_24e63f91_for_ts)(victim->ts).v;
      if (bVar3) {
        victim->ts = local_38;
      }
      UNLOCK();
      if (bVar3) {
        p_Var2 = victim->dq + ((ulong)aVar1 & 0xffffffff);
        p_Var2->thief = self->_public;
        (*p_Var2->f)(self,__dq_head,p_Var2);
        p_Var2->thief = (_Worker *)0x2;
        return (Worker *)0x0;
      }
      return (Worker *)0x1;
    }
    if (victim->movesplit == '\0') {
      victim->movesplit = '\x01';
    }
  }
  return (Worker *)0x2;
}

Assistant:

lace_steal(WorkerP *self, Task *__dq_head, Worker *victim)
{
    if (victim != NULL && !victim->allstolen) {
        TailSplitNA ts;
        ts.v = victim->ts.v;
        if (ts.ts.tail < ts.ts.split) {
            TailSplitNA ts_new;
            ts_new.v = ts.v;
            ts_new.ts.tail++;
            if (atomic_compare_exchange_weak(&victim->ts.v, &ts.v, ts_new.v)) {
                // Stolen
                Task *t = &victim->dq[ts.ts.tail];
                atomic_store_explicit(&t->thief, self->_public, memory_order_relaxed);
                lace_time_event(self, 1);
                t->f(self, __dq_head, t);
                lace_time_event(self, 2);
                atomic_store_explicit(&t->thief, THIEF_COMPLETED, memory_order_release);
                lace_time_event(self, 8);
                return LACE_STOLEN;
            }

            lace_time_event(self, 7);
            return LACE_BUSY;
        }

        if (victim->movesplit == 0) {
            victim->movesplit = 1;
            PR_COUNTSPLITS(self, CTR_split_req);
        }
    }

    lace_time_event(self, 7);
    return LACE_NOWORK;
}